

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O2

void __thiscall SessionObjectStore::clearStore(SessionObjectStore *this)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  MutexLocker lock;
  set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> clearObjects;
  MutexLocker local_50;
  _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
  local_40;
  
  MutexLocker::MutexLocker(&local_50,this->storeMutex);
  std::
  _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
  ::clear(&(this->objects)._M_t);
  std::
  _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
  ::_Rb_tree(&local_40,&(this->allObjects)._M_t);
  std::
  _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
  ::clear(&(this->allObjects)._M_t);
  for (p_Var1 = local_40._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &local_40._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  std::
  _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
  ::~_Rb_tree(&local_40);
  MutexLocker::~MutexLocker(&local_50);
  return;
}

Assistant:

void SessionObjectStore::clearStore()
{
	MutexLocker lock(storeMutex);

	objects.clear();
	std::set<SessionObject*> clearObjects = allObjects;
	allObjects.clear();

	for (std::set<SessionObject*>::iterator i = clearObjects.begin(); i != clearObjects.end(); i++)
	{
		delete *i;
	}
}